

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglClientExtensionTests.cpp
# Opt level: O1

int __thiscall deqp::egl::ClientExtensionTests::init(ClientExtensionTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCase *pTVar1;
  
  pTVar1 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"base",
                     "Basic tests for EGL_EXT_client_extensions");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_003ec6b0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"disjoint",
                     "Check that client and display extensions are disjoint");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_003ec700;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"extensions",
                     "Check that returned extensions are client or display extensions");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_003ec750;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void ClientExtensionTests::init (void)
{
	addChild(new BaseTest(m_eglTestCtx));
	addChild(new DisjointTest(m_eglTestCtx));
	addChild(new CheckExtensionsTest(m_eglTestCtx));
}